

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverIo.c
# Opt level: O0

void Msat_SolverWriteDimacs(Msat_Solver_t *p,char *pFileName)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  Msat_Clause_t **ppMVar4;
  int local_30;
  uint local_2c;
  int i;
  int nClauses;
  Msat_Clause_t **pClauses;
  FILE *pFile;
  char *pFileName_local;
  Msat_Solver_t *p_local;
  
  iVar1 = Msat_ClauseVecReadSize(p->vClauses);
  iVar2 = Msat_ClauseVecReadSize(p->vLearned);
  local_2c = iVar1 + iVar2;
  for (local_30 = 0; local_30 < p->nVars; local_30 = local_30 + 1) {
    local_2c = (p->pLevel[local_30] == 0) + local_2c;
  }
  __stream = fopen(pFileName,"wb");
  pcVar3 = Msat_TimeStamp();
  fprintf(__stream,"c Produced by Msat_SolverWriteDimacs() on %s\n",pcVar3);
  fprintf(__stream,"p cnf %d %d\n",(ulong)(uint)p->nVars,(ulong)local_2c);
  iVar1 = Msat_ClauseVecReadSize(p->vClauses);
  ppMVar4 = Msat_ClauseVecReadArray(p->vClauses);
  for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
    Msat_ClauseWriteDimacs((FILE *)__stream,ppMVar4[local_30],1);
  }
  iVar1 = Msat_ClauseVecReadSize(p->vLearned);
  ppMVar4 = Msat_ClauseVecReadArray(p->vLearned);
  for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
    Msat_ClauseWriteDimacs((FILE *)__stream,ppMVar4[local_30],1);
  }
  for (local_30 = 0; local_30 < p->nVars; local_30 = local_30 + 1) {
    if (p->pLevel[local_30] == 0) {
      pcVar3 = "";
      if ((p->pAssigns[local_30] & 1U) != 0) {
        pcVar3 = "-";
      }
      fprintf(__stream,"%s%d 0\n",pcVar3,(ulong)(local_30 + 1));
    }
  }
  fprintf(__stream,"\n");
  fclose(__stream);
  return;
}

Assistant:

void Msat_SolverWriteDimacs( Msat_Solver_t * p, char * pFileName )
{
    FILE * pFile;
    Msat_Clause_t ** pClauses;
    int nClauses, i;

    nClauses = Msat_ClauseVecReadSize(p->vClauses) + Msat_ClauseVecReadSize(p->vLearned);
    for ( i = 0; i < p->nVars; i++ )
        nClauses += ( p->pLevel[i] == 0 );

    pFile = fopen( pFileName, "wb" );
    fprintf( pFile, "c Produced by Msat_SolverWriteDimacs() on %s\n", Msat_TimeStamp() );
    fprintf( pFile, "p cnf %d %d\n", p->nVars, nClauses );

    nClauses = Msat_ClauseVecReadSize( p->vClauses );
    pClauses = Msat_ClauseVecReadArray( p->vClauses );
    for ( i = 0; i < nClauses; i++ )
        Msat_ClauseWriteDimacs( pFile, pClauses[i], 1 );

    nClauses = Msat_ClauseVecReadSize( p->vLearned );
    pClauses = Msat_ClauseVecReadArray( p->vLearned );
    for ( i = 0; i < nClauses; i++ )
        Msat_ClauseWriteDimacs( pFile, pClauses[i], 1 );

    // write zero-level assertions
    for ( i = 0; i < p->nVars; i++ )
        if ( p->pLevel[i] == 0 )
            fprintf( pFile, "%s%d 0\n", ((p->pAssigns[i]&1)? "-": ""), i + 1 );

    fprintf( pFile, "\n" );
    fclose( pFile );
}